

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_uint0.c
# Opt level: O0

uint fmt_uint0(char *s,uint u,uint n)

{
  uint local_1c;
  uint len;
  uint n_local;
  uint u_local;
  char *s_local;
  
  local_1c = fmt_uint((char *)0x0,u);
  _n_local = s;
  for (; local_1c < n; local_1c = local_1c + 1) {
    if (_n_local != (char *)0x0) {
      *_n_local = '0';
      _n_local = _n_local + 1;
    }
  }
  if (_n_local != (char *)0x0) {
    fmt_uint(_n_local,u);
  }
  return local_1c;
}

Assistant:

unsigned int fmt_uint0(char *s,unsigned int u,unsigned int n)
{
  unsigned int len;
  len = fmt_uint(FMT_LEN,u);
  while (len < n) { if (s) *s++ = '0'; ++len; }
  if (s) fmt_uint(s,u);
  return len;
}